

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool BackwardPass::ProcessBlock(BasicBlock*)::ByteCodeRegisterUsesTracker::IsInstrOffsetBoundary(IR
     ::Instr__(Instr *instr)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  bool local_2a;
  byte local_29;
  Instr *local_28;
  Instr *prev;
  uint32 bytecodeOffset;
  Instr *instr_local;
  
  bVar1 = IsValidByteCodeOffset(IR::Instr__(instr);
  if (bVar1) {
    if (instr->m_opcode == Leave) {
      instr_local._7_1_ = true;
    }
    else {
      uVar2 = IR::Instr::GetByteCodeOffset(instr);
      local_28 = instr->m_prev;
      while( true ) {
        local_29 = 0;
        if (local_28 != (Instr *)0x0) {
          bVar1 = IsValidByteCodeOffset(IR::Instr__(local_28);
          local_29 = bVar1 ^ 0xff;
        }
        if ((local_29 & 1) == 0) break;
        local_28 = local_28->m_prev;
      }
      local_2a = true;
      if (local_28 != (Instr *)0x0) {
        uVar3 = IR::Instr::GetByteCodeOffset(local_28);
        local_2a = uVar3 != uVar2;
      }
      instr_local._7_1_ = local_2a;
    }
  }
  else {
    instr_local._7_1_ = false;
  }
  return instr_local._7_1_;
}

Assistant:

static bool IsInstrOffsetBoundary(IR::Instr* instr)
        {
            if (IsValidByteCodeOffset(instr))
            {
                if (instr->m_opcode == Js::OpCode::Leave)
                {
                    // Leave is a special case, capture now and ignore other instrs at that offset
                    return true;
                }
                else
                {
                    uint32 bytecodeOffset = instr->GetByteCodeOffset();
                    IR::Instr* prev = instr->m_prev;
                    while (prev && !IsValidByteCodeOffset(prev))
                    {
                        prev = prev->m_prev;
                    }
                    return !prev || prev->GetByteCodeOffset() != bytecodeOffset;
                }
            }
            return false;
        }